

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_check_watchpoint_mips64(CPUState *cpu,uintptr_t retaddr)

{
  TCGContext_conflict5 *tcg_ctx;
  TranslationBlock *tb;
  tb_page_addr_t start;
  
  tcg_ctx = (TCGContext_conflict5 *)cpu->uc->tcg_ctx;
  tb = tcg_tb_lookup_mips64(tcg_ctx,retaddr);
  if (tb != (TranslationBlock *)0x0) {
    cpu_restore_state_from_tb(cpu,tb,retaddr,true);
    tb_phys_invalidate_mips64(tcg_ctx,tb,0xffffffffffffffff);
    return;
  }
  start = get_page_addr_code_mips64
                    ((CPUArchState_conflict11 *)cpu->env_ptr,
                     (((CPUArchState_conflict11 *)cpu->env_ptr)->active_tc).PC);
  if (start != 0xffffffffffffffff) {
    tb_invalidate_phys_range_mips64((uc_struct_conflict6 *)cpu->uc,start,start + 1);
    return;
  }
  return;
}

Assistant:

void tb_check_watchpoint(CPUState *cpu, uintptr_t retaddr)
{
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    TranslationBlock *tb;

    assert_memory_lock();

    tb = tcg_tb_lookup(tcg_ctx, retaddr);
    if (tb) {
        /* We can use retranslation to find the PC.  */
        cpu_restore_state_from_tb(cpu, tb, retaddr, true);
        tb_phys_invalidate(tcg_ctx, tb, -1);
    } else {
        /* The exception probably happened in a helper.  The CPU state should
           have been saved before calling it. Fetch the PC from there.  */
        CPUArchState *env = cpu->env_ptr;
        target_ulong pc, cs_base;
        tb_page_addr_t addr;
        uint32_t flags;

        cpu_get_tb_cpu_state(env, &pc, &cs_base, &flags);
        addr = get_page_addr_code(env, pc);
        if (addr != -1) {
            tb_invalidate_phys_range(cpu->uc, addr, addr + 1);
        }
    }
}